

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,cmCustomCommandGenerator *ccg,cmGeneratorTarget *target,string *relative,
          bool echo_comment,ostream *content)

{
  pointer pcVar1;
  cmMakefile *this_00;
  cmGlobalGenerator *pcVar2;
  pointer pbVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  TargetType targetType;
  string *psVar7;
  long lVar8;
  long lVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  pointer this_01;
  uint c;
  char cVar14;
  undefined7 in_register_00000089;
  char *__s;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  string_view source;
  string_view source_00;
  string shellCommand;
  string dir;
  string launcher;
  string cmd;
  string val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string workingDir;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> comment
  ;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  cmGeneratorTarget *local_248;
  string local_240;
  cmRulePlaceholderExpander *local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  long *local_1f8;
  _Alloc_hider local_1f0;
  long local_1e8 [2];
  long *local_1d8;
  char *local_1d0;
  long local_1c8 [2];
  string local_1b8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_198;
  string *local_190;
  undefined1 local_188 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  char *local_168;
  char *local_160;
  char *local_158;
  long *local_150;
  long **local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  
  local_248 = target;
  local_190 = relative;
  if ((int)CONCAT71(in_register_00000089,echo_comment) != 0) {
    cmCustomCommandGenerator::GetComment_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_188,ccg);
    if ((bool)(byte)local_168 == true) {
      AppendEcho(this,commands,(string *)local_188,EchoGenerate,(EchoProgress *)0x0);
    }
    if (((byte)local_168 & 1) != 0) {
      local_168 = (char *)((ulong)local_168 & 0xffffffffffffff00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._0_8_ != &local_178) {
        operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity + 1);
      }
    }
  }
  psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  pcVar1 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,pcVar1,pcVar1 + psVar7->_M_string_length);
  cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&local_1b8,ccg);
  if (local_1b8._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&local_2c8);
  }
  if (content != (ostream *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (content,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
  }
  local_198 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands;
  (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
    _vptr_cmOutputConverter[6])(&local_220,this);
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  c = 0;
  do {
    uVar5 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
    if (uVar5 <= c) {
      CreateCDCommand(this,&local_218,&local_2c8,local_190);
      pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
      bVar4 = cmCustomCommand::GetJobserverAware(ccg->CC);
      if (bVar4) {
        iVar6 = (*pcVar2->_vptr_cmGlobalGenerator[0xf])(pcVar2);
        pbVar3 = local_218.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((char)iVar6 != '\0') {
          if (local_218.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_218.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            this_01 = local_218.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              local_168 = (this_01->_M_dataplus)._M_p;
              local_178._8_8_ = this_01->_M_string_length;
              local_188._0_8_ = (pointer)0x1;
              local_188._8_8_ = (long)"VC++" + 3;
              local_178._M_allocated_capacity = 0;
              local_160 = (char *)0x0;
              views_03._M_len = 2;
              views_03._M_array = (iterator)local_188;
              cmCatViews(&local_288,views_03);
              std::__cxx11::string::operator=((string *)this_01,(string *)&local_288);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_288._M_dataplus._M_p != &local_288.field_2) {
                operator_delete(local_288._M_dataplus._M_p,
                                local_288.field_2._M_allocated_capacity + 1);
              }
              this_01 = this_01 + 1;
            } while (this_01 != pbVar3);
          }
        }
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (local_198,*(undefined8 *)(local_198 + 8),
                 local_218.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_218.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_218);
      if (local_220 != (cmRulePlaceholderExpander *)0x0) {
        (*(local_220->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    cmCustomCommandGenerator::GetCommand_abi_cxx11_(&local_288,ccg,c);
    if (local_288._M_string_length != 0) {
      bVar4 = cmLocalGenerator::IsWindowsShell((cmLocalGenerator *)this);
      if (bVar4) {
        local_188._0_8_ = &local_178;
        local_188._8_8_ = (long *)0x0;
        local_178._M_allocated_capacity = local_178._M_allocated_capacity & 0xffffffffffffff00;
        if (local_288._M_string_length < 5) {
LAB_00569bc3:
          bVar4 = false;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_240,(ulong)&local_288);
          cmsys::SystemTools::LowerCase(&local_2a8,&local_240);
          std::__cxx11::string::operator=((string *)local_188,(string *)&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,
                            CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                                     local_2a8.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
          iVar6 = std::__cxx11::string::compare(local_188);
          if (iVar6 != 0) {
            iVar6 = std::__cxx11::string::compare(local_188);
            if (iVar6 != 0) goto LAB_00569bc3;
          }
          bVar4 = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._0_8_ != &local_178) {
          operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity + 1);
        }
      }
      else {
        bVar4 = false;
      }
      cmsys::SystemTools::ReplaceString(&local_288,"/./","/");
      cVar14 = (char)&local_288;
      lVar8 = std::__cxx11::string::find(cVar14,0x2f);
      if (local_1b8._M_string_length == 0) {
        cmOutputConverter::MaybeRelativeToCurBinDir
                  ((string *)local_188,(cmOutputConverter *)this,&local_288);
        std::__cxx11::string::operator=((string *)&local_288,(string *)local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._0_8_ != &local_178) {
          operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity + 1);
        }
      }
      lVar9 = std::__cxx11::string::find(cVar14,0x2f);
      if ((lVar8 != -1) && (lVar9 == -1)) {
        local_188._0_8_ = (pointer)0x2;
        local_188._8_8_ = (long)"/../" + 2;
        local_178._M_allocated_capacity = 0;
        local_178._8_8_ = local_288._M_string_length;
        local_168 = local_288._M_dataplus._M_p;
        local_160 = (char *)0x0;
        views._M_len = 2;
        views._M_array = (iterator)local_188;
        cmCatViews(&local_2a8,views);
        std::__cxx11::string::operator=((string *)&local_288,(string *)&local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,
                          CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                                   local_2a8.field_2._M_local_buf[0]) + 1);
        }
      }
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      local_2a8._M_string_length = 0;
      local_2a8.field_2._M_local_buf[0] = '\0';
      local_188._0_8_ = &local_178;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"RULE_LAUNCH_CUSTOM","");
      this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"CMAKE_BUILD_TYPE","");
      psVar7 = cmMakefile::GetSafeDefinition(this_00,&local_2e8);
      cmLocalGenerator::GetRuleLauncher
                (&local_240,(cmLocalGenerator *)this,local_248,(string *)local_188,psVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,
                        CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                 local_2e8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._0_8_ != &local_178) {
        operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity + 1);
      }
      if (local_240._M_string_length != 0) {
        memset(local_188,0,0x158);
        psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(local_248);
        local_188._0_8_ = (psVar7->_M_dataplus)._M_p;
        targetType = cmGeneratorTarget::GetType(local_248);
        psVar7 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
        local_188._8_8_ = (psVar7->_M_dataplus)._M_p;
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        local_2e8._M_string_length = 0;
        local_2e8.field_2._M_local_buf[0] = '\0';
        pvVar10 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
        if ((pvVar10->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (pvVar10->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::_M_assign((string *)&local_2e8);
          if (local_1b8._M_string_length == 0) {
            cmOutputConverter::MaybeRelativeToCurBinDir
                      (&local_268,(cmOutputConverter *)this,&local_2e8);
            std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_268);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1
                             );
            }
          }
          source._M_str = local_2e8._M_dataplus._M_p;
          source._M_len = local_2e8._M_string_length;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&local_268,(cmOutputConverter *)this,source,SHELL,false);
          std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_268);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
        }
        local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e8._M_dataplus._M_p;
        std::__cxx11::string::_M_assign((string *)&local_2a8);
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (local_220,(cmOutputConverter *)this,&local_2a8,(RuleVariables *)local_188);
        if (local_2a8._M_string_length != 0) {
          std::__cxx11::string::append((char *)&local_2a8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,
                          CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                   local_2e8.field_2._M_local_buf[0]) + 1);
        }
      }
      MaybeConvertWatcomShellCommand(&local_2e8,this,&local_288);
      if (local_2e8._M_string_length == 0) {
        source_00._M_str = local_288._M_dataplus._M_p;
        source_00._M_len = local_288._M_string_length;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  ((string *)local_188,(cmOutputConverter *)this,source_00,SHELL,false);
        std::__cxx11::string::operator=((string *)&local_2e8,(string *)local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._0_8_ != &local_178) {
          operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity + 1);
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     &local_2a8,&local_2e8);
      std::__cxx11::string::operator=((string *)&local_288,(string *)local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._0_8_ != &local_178) {
        operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity + 1);
      }
      cmCustomCommandGenerator::AppendArguments(ccg,c,&local_288);
      if (content != (ostream *)0x0) {
        if (local_288._M_dataplus._M_p == (char *)0x0) {
          std::ios::clear((int)content + (int)content->_vptr_basic_ostream[-3]);
        }
        else {
          __s = local_288._M_dataplus._M_p + local_2a8._M_string_length;
          sVar11 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(content,__s,sVar11);
        }
      }
      if (this->BorlandMakeCurlyHack == true) {
        uVar12 = std::__cxx11::string::find(cVar14,0x7b);
        if ((uVar12 != 0xffffffffffffffff) && (uVar12 < local_288._M_string_length - 1)) {
          uVar13 = std::__cxx11::string::find(cVar14,0x7d);
          if (uVar12 < uVar13) {
            std::__cxx11::string::substr((ulong)&local_1f8,(ulong)&local_288);
            std::__cxx11::string::substr((ulong)&local_1d8,(ulong)&local_288);
            local_188._0_8_ = local_1f0._M_p;
            local_188._8_8_ = local_1f8;
            local_178._M_allocated_capacity = (size_type)&local_1f8;
            local_178._8_8_ = 3;
            local_168 = "{{}";
            local_160 = (char *)0x0;
            local_158 = local_1d0;
            local_150 = local_1d8;
            views_00._M_len = 3;
            views_00._M_array = (iterator)local_188;
            local_148 = &local_1d8;
            cmCatViews(&local_268,views_00);
            std::__cxx11::string::operator=((string *)&local_288,(string *)&local_268);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1d8 != local_1c8) {
              operator_delete(local_1d8,local_1c8[0] + 1);
            }
            if (local_1f8 != local_1e8) {
              operator_delete(local_1f8,local_1e8[0] + 1);
            }
          }
        }
      }
      if (local_2a8._M_string_length == 0) {
        if (bVar4) {
          local_188._0_8_ = (pointer)0x5;
          local_188._8_8_ = "call ";
          local_178._M_allocated_capacity = 0;
          local_178._8_8_ = local_288._M_string_length;
          local_168 = local_288._M_dataplus._M_p;
          local_160 = (char *)0x0;
          views_01._M_len = 2;
          views_01._M_array = (iterator)local_188;
          cmCatViews(&local_268,views_01);
        }
        else {
          bVar4 = cmLocalGenerator::IsNMake((cmLocalGenerator *)this);
          if ((!bVar4) || (*local_288._M_dataplus._M_p != '\"')) goto LAB_0056a272;
          local_188._0_8_ = (pointer)0xd;
          local_188._8_8_ = "echo >nul && ";
          local_178._M_allocated_capacity = 0;
          local_178._8_8_ = local_288._M_string_length;
          local_168 = local_288._M_dataplus._M_p;
          local_160 = (char *)0x0;
          views_02._M_len = 2;
          views_02._M_array = (iterator)local_188;
          cmCatViews(&local_268,views_02);
        }
        std::__cxx11::string::operator=((string *)&local_288,(string *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
      }
LAB_0056a272:
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_218,
                 &local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,
                        CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                 local_2e8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,
                        CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                                 local_2a8.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    c = c + 1;
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomCommand(
  std::vector<std::string>& commands, cmCustomCommandGenerator const& ccg,
  cmGeneratorTarget* target, std::string const& relative, bool echo_comment,
  std::ostream* content)
{
  // Optionally create a command to display the custom command's
  // comment text.  This is used for pre-build, pre-link, and
  // post-build command comments.  Custom build step commands have
  // their comments generated elsewhere.
  if (echo_comment) {
    if (cm::optional<std::string> comment = ccg.GetComment()) {
      this->AppendEcho(commands, *comment,
                       cmLocalUnixMakefileGenerator3::EchoGenerate);
    }
  }

  // if the command specified a working directory use it.
  std::string dir = this->GetCurrentBinaryDirectory();
  std::string workingDir = ccg.GetWorkingDirectory();
  if (!workingDir.empty()) {
    dir = workingDir;
  }
  if (content) {
    *content << dir;
  }

  auto rulePlaceholderExpander = this->CreateRulePlaceholderExpander();

  // Add each command line to the set of commands.
  std::vector<std::string> commands1;
  for (unsigned int c = 0; c < ccg.GetNumberOfCommands(); ++c) {
    // Build the command line in a single string.
    std::string cmd = ccg.GetCommand(c);
    if (!cmd.empty()) {
      // Use "call " before any invocations of .bat or .cmd files
      // invoked as custom commands in the WindowsShell.
      //
      bool useCall = false;

      if (this->IsWindowsShell()) {
        std::string suffix;
        if (cmd.size() > 4) {
          suffix = cmSystemTools::LowerCase(cmd.substr(cmd.size() - 4));
          if (suffix == ".bat" || suffix == ".cmd") {
            useCall = true;
          }
        }
      }

      cmSystemTools::ReplaceString(cmd, "/./", "/");
      // Convert the command to a relative path only if the current
      // working directory will be the start-output directory.
      bool had_slash = cmd.find('/') != std::string::npos;
      if (workingDir.empty()) {
        cmd = this->MaybeRelativeToCurBinDir(cmd);
      }
      bool has_slash = cmd.find('/') != std::string::npos;
      if (had_slash && !has_slash) {
        // This command was specified as a path to a file in the
        // current directory.  Add a leading "./" so it can run
        // without the current directory being in the search path.
        cmd = cmStrCat("./", cmd);
      }

      std::string launcher;
      // Short-circuit if there is no launcher.
      std::string val = this->GetRuleLauncher(
        target, "RULE_LAUNCH_CUSTOM",
        this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
      if (cmNonempty(val)) {
        // Expand rule variables referenced in the given launcher command.
        cmRulePlaceholderExpander::RuleVariables vars;
        vars.CMTargetName = target->GetName().c_str();
        vars.CMTargetType =
          cmState::GetTargetTypeName(target->GetType()).c_str();
        std::string output;
        const std::vector<std::string>& outputs = ccg.GetOutputs();
        if (!outputs.empty()) {
          output = outputs[0];
          if (workingDir.empty()) {
            output = this->MaybeRelativeToCurBinDir(output);
          }
          output =
            this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
        }
        vars.Output = output.c_str();

        launcher = val;
        rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
        if (!launcher.empty()) {
          launcher += " ";
        }
      }

      std::string shellCommand = this->MaybeConvertWatcomShellCommand(cmd);
      if (shellCommand.empty()) {
        shellCommand =
          this->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL);
      }
      cmd = launcher + shellCommand;

      ccg.AppendArguments(c, cmd);
      if (content) {
        // Rule content does not include the launcher.
        *content << (cmd.c_str() + launcher.size());
      }
      if (this->BorlandMakeCurlyHack) {
        // Borland Make has a very strange bug.  If the first curly
        // brace anywhere in the command string is a left curly, it
        // must be written {{} instead of just {.  Otherwise some
        // curly braces are removed.  The hack can be skipped if the
        // first curly brace is the last character.
        std::string::size_type lcurly = cmd.find('{');
        if (lcurly != std::string::npos && lcurly < (cmd.size() - 1)) {
          std::string::size_type rcurly = cmd.find('}');
          if (rcurly == std::string::npos || rcurly > lcurly) {
            // The first curly is a left curly.  Use the hack.
            cmd =
              cmStrCat(cmd.substr(0, lcurly), "{{}", cmd.substr(lcurly + 1));
          }
        }
      }
      if (launcher.empty()) {
        if (useCall) {
          cmd = cmStrCat("call ", cmd);
        } else if (this->IsNMake() && cmd[0] == '"') {
          cmd = cmStrCat("echo >nul && ", cmd);
        }
      }
      commands1.push_back(std::move(cmd));
    }
  }

  // Setup the proper working directory for the commands.
  this->CreateCDCommand(commands1, dir, relative);

  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);

  // Prefix the commands with the jobserver prefix "+"
  if (ccg.GetCC().GetJobserverAware() && gg->IsGNUMakeJobServerAware()) {
    std::transform(commands1.begin(), commands1.end(), commands1.begin(),
                   [](std::string const& cmd) { return cmStrCat("+", cmd); });
  }

  // push back the custom commands
  cm::append(commands, commands1);
}